

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void EncodeWindowBits(int lgwin,int large_window,uint16_t *last_bytes,uint8_t *last_bytes_bits)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  if (large_window == 0) {
    if (lgwin == 0x10) {
      uVar1 = '\x01';
      uVar2 = 0;
    }
    else if (lgwin == 0x11) {
      uVar1 = '\a';
      uVar2 = 1;
    }
    else if (lgwin < 0x12) {
      uVar2 = (short)lgwin * 0x10 - 0x7f;
      uVar1 = '\a';
    }
    else {
      uVar2 = (short)lgwin * 2 - 0x21;
      uVar1 = '\x04';
    }
  }
  else {
    uVar2 = (ushort)((lgwin & 0x3fU) << 8) | 0x11;
    uVar1 = '\x0e';
  }
  *last_bytes = uVar2;
  *last_bytes_bits = uVar1;
  return;
}

Assistant:

static void EncodeWindowBits(int lgwin, BROTLI_BOOL large_window,
    uint16_t* last_bytes, uint8_t* last_bytes_bits) {
  if (large_window) {
    *last_bytes = (uint16_t)(((lgwin & 0x3F) << 8) | 0x11);
    *last_bytes_bits = 14;
  } else {
    if (lgwin == 16) {
      *last_bytes = 0;
      *last_bytes_bits = 1;
    } else if (lgwin == 17) {
      *last_bytes = 1;
      *last_bytes_bits = 7;
    } else if (lgwin > 17) {
      *last_bytes = (uint16_t)(((lgwin - 17) << 1) | 0x01);
      *last_bytes_bits = 4;
    } else {
      *last_bytes = (uint16_t)(((lgwin - 8) << 4) | 0x01);
      *last_bytes_bits = 7;
    }
  }
}